

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O2

void __thiscall
kj::_::
TransformPromiseNode<kj::Promise<void>,_kj::_::Void,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-test.c++:420:27),_kj::_::PropagateException>
::getImpl(TransformPromiseNode<kj::Promise<void>,_kj::_::Void,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_async_test_c__:420:27),_kj::_::PropagateException>
          *this,ExceptionOrValue *output)

{
  ExceptionOr<kj::_::Void> depResult;
  Exception local_5a8;
  ExceptionOr<kj::Promise<void>_> local_448;
  NullableValue<kj::Exception> local_2d0;
  char local_170;
  Exception local_168;
  
  local_2d0.isSet = false;
  local_170 = '\0';
  TransformPromiseNodeBase::getDepResult
            (&this->super_TransformPromiseNodeBase,(ExceptionOrValue *)&local_2d0);
  if (local_2d0.isSet == true) {
    Exception::Exception(&local_168,&local_2d0.field_1.value);
    local_5a8.ownFile.content.ptr = local_168.ownFile.content.ptr;
    local_5a8.ownFile.content.size_ = local_168.ownFile.content.size_;
    local_5a8.ownFile.content.disposer = local_168.ownFile.content.disposer;
    local_168.ownFile.content.ptr = (char *)0x0;
    local_168.ownFile.content.size_ = 0;
    local_5a8.file = local_168.file;
    local_5a8.line = local_168.line;
    local_5a8.type = local_168.type;
    local_5a8.description.content.ptr = local_168.description.content.ptr;
    local_5a8.description.content.size_ = local_168.description.content.size_;
    local_168.description.content.ptr = (char *)0x0;
    local_168.description.content.size_ = 0;
    local_5a8.description.content.disposer = local_168.description.content.disposer;
    local_5a8.context.ptr.disposer = local_168.context.ptr.disposer;
    local_5a8.context.ptr.ptr = local_168.context.ptr.ptr;
    local_168.context.ptr.ptr = (Context *)0x0;
    memcpy(local_5a8.trace,local_168.trace,0x104);
    NullableValue<kj::Exception>::NullableValue
              ((NullableValue<kj::Exception> *)&local_448,&local_5a8);
    local_448.value.ptr.isSet = false;
    Exception::~Exception(&local_5a8);
    ExceptionOr<kj::Promise<void>_>::operator=((ExceptionOr<kj::Promise<void>_> *)output,&local_448)
    ;
    ExceptionOr<kj::Promise<void>_>::~ExceptionOr(&local_448);
    Exception::~Exception(&local_168);
  }
  else if (local_170 == '\x01') {
    anon_class_8_1_bc7188dc_for_func::operator()((anon_class_8_1_bc7188dc_for_func *)&local_5a8);
    local_448.super_ExceptionOrValue.exception.ptr.isSet = false;
    local_448.value.ptr.isSet = true;
    local_448.value.ptr.field_1.value.super_PromiseBase.node.disposer =
         (Disposer *)local_5a8.ownFile.content.ptr;
    local_448.value.ptr.field_1.value.super_PromiseBase.node.ptr =
         (PromiseNode *)local_5a8.ownFile.content.size_;
    local_5a8.ownFile.content.size_ = 0;
    ExceptionOr<kj::Promise<void>_>::operator=((ExceptionOr<kj::Promise<void>_> *)output,&local_448)
    ;
    ExceptionOr<kj::Promise<void>_>::~ExceptionOr(&local_448);
    Own<kj::_::PromiseNode>::dispose((Own<kj::_::PromiseNode> *)&local_5a8);
  }
  NullableValue<kj::Exception>::~NullableValue(&local_2d0);
  return;
}

Assistant:

void getImpl(ExceptionOrValue& output) override {
    ExceptionOr<DepT> depResult;
    getDepResult(depResult);
    KJ_IF_MAYBE(depException, depResult.exception) {
      output.as<T>() = handle(
          MaybeVoidCaller<Exception, FixVoid<ReturnType<ErrorFunc, Exception>>>::apply(
              errorHandler, kj::mv(*depException)));
    } else KJ_IF_MAYBE(depValue, depResult.value) {
      output.as<T>() = handle(MaybeVoidCaller<DepT, T>::apply(func, kj::mv(*depValue)));
    }
  }